

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testwidgets.cpp
# Opt level: O0

Am_Value get_other_form_proc(Am_Object *self)

{
  Am_Value *pAVar1;
  Am_Value *pAVar2;
  anon_union_8_8_ea4c8939_for_value extraout_RDX;
  anon_union_8_8_ea4c8939_for_value extraout_RDX_00;
  anon_union_8_8_ea4c8939_for_value aVar3;
  ushort in_SI;
  Am_Value AVar4;
  Am_Object local_28;
  Am_Object other;
  Am_Object *self_local;
  Am_Value *value;
  
  other.data._7_1_ = 0;
  Am_Value::Am_Value((Am_Value *)self);
  Am_Object::Am_Object(&local_28);
  pAVar1 = (Am_Value *)Am_Object::Get(in_SI,0x16d);
  Am_Object::operator=(&local_28,pAVar1);
  pAVar2 = Am_Object::Peek(&local_28,0x169,0);
  Am_Value::operator=((Am_Value *)self,(Am_Value *)pAVar2);
  other.data._7_1_ = 1;
  Am_Object::~Am_Object(&local_28);
  aVar3 = extraout_RDX;
  if ((other.data._7_1_ & 1) == 0) {
    Am_Value::~Am_Value((Am_Value *)self);
    aVar3 = extraout_RDX_00;
  }
  AVar4.value.wrapper_value = aVar3.wrapper_value;
  AVar4._0_8_ = self;
  return AVar4;
}

Assistant:

Am_Define_Formula(Am_Value, get_other_form)
{
  Am_Value value;
  Am_Object other;
  other = self.Get(Am_OBJECT_MODIFIED);
  value = other.Peek(Am_VALUE);
  return value;
}